

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void sprint_dns(char *dns)

{
  int iVar1;
  char *dest;
  char buffer [2048];
  char acStack_818 [2056];
  
  iVar1 = sprint_dns_header(acStack_818,dns);
  dest = acStack_818 + iVar1;
  if (*(short *)(dns + 4) != 0) {
    iVar1 = sprint_dns_questions(dest,dns);
    dest = dest + iVar1;
  }
  if (*(short *)(dns + 6) != 0) {
    sprint_dns_answers(dest,dns);
  }
  puts(acStack_818);
  fflush(_stdout);
  return;
}

Assistant:

void sprint_dns(char *dns) {
  char buffer[2048];
  char *dest = buffer;
  struct dns_header *header;
  header = (struct dns_header *)dns;
  dest += sprint_dns_header(dest, dns);

  // const char* query_start = dns + sizeof(struct header_struct);
  // dest+=sprint_dns_header(dest,dns);
  if (header->qdcount) { //大端小端 0都是00 00
    dest += sprint_dns_questions(dest, dns);
  }
  if (header->ancount) { //大端小端 0都是00 00
    dest += sprint_dns_answers(dest, dns);
  }
  puts(buffer);
  // fflush(stdout);
  fflush(stdout);
}